

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O2

double TestSpectra::B8_spectrum(double xMin,double xMax)

{
  RandomGen *pRVar1;
  double dVar2;
  double xMin_00;
  initializer_list<double> __l;
  allocator_type local_69;
  double local_68;
  undefined8 uStack_60;
  vector<double,_std::allocator<double>_> xyTry;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  xMin_00 = (double)(-(ulong)(xMin == 0.0) & (ulong)xMin);
  local_68 = 4.0 - xMin_00;
  pRVar1 = RandomGen::rndm();
  dVar2 = RandomGen::rand_uniform(pRVar1);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar2 * local_68 + xMin_00);
  pRVar1 = RandomGen::rndm();
  dVar2 = RandomGen::rand_uniform(pRVar1);
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)(dVar2 * 0.00633869711256927);
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_28;
  std::vector<double,_std::allocator<double>_>::vector(&xyTry,__l,&local_69);
  while (local_68 = *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
        0.0 < xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2]) {
    uStack_60 = 0;
    dVar2 = local_68;
    local_68 = local_68 * local_68 * -0.32849 + local_68 * 1.2184 + 2.198;
    dVar2 = pow(dVar2,3.0);
    local_68 = pow(10.0,-(local_68 + dVar2 * 0.12441));
    pRVar1 = RandomGen::rndm();
    RandomGen::VonNeumann
              ((vector<double,_std::allocator<double>_> *)&local_28,pRVar1,xMin_00,4.0,0.0,
               0.00633869711256927,
               *xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
               xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1],local_68);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&xyTry,&local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xyTry.super__Vector_base<double,_std::allocator<double>_>);
  return local_68;
}

Assistant:

double TestSpectra::B8_spectrum(double xMin, double xMax) {
  if (xMax != 4.) xMax = 4.;
  if (xMin != 0.) xMin = 0.;
  double yMax = pow(10., -2.198);
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = 2.198 + 1.2184 * xyTry[0] - 0.32849 * pow(xyTry[0], 2.) +
                       0.12441 * pow(xyTry[0], 3.);
    FuncValue = pow(10., -FuncValue);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}